

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O0

void helics::BrokerFactory::defineBrokerBuilder
               (shared_ptr<helics::BrokerFactory::BrokerBuilder> *builder,string_view name,int code)

{
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> *this;
  string_view in_stack_ffffffffffffffa8;
  shared_ptr<helics::BrokerFactory::BrokerBuilder> local_30 [3];
  
  this = local_30;
  std::shared_ptr<helics::BrokerFactory::BrokerBuilder>::shared_ptr
            (this,(shared_ptr<helics::BrokerFactory::BrokerBuilder> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  MasterBrokerBuilder::addBuilder(this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff9c);
  std::shared_ptr<helics::BrokerFactory::BrokerBuilder>::~shared_ptr
            ((shared_ptr<helics::BrokerFactory::BrokerBuilder> *)0x437c9a);
  return;
}

Assistant:

void defineBrokerBuilder(std::shared_ptr<BrokerBuilder> builder, std::string_view name, int code)
{
    MasterBrokerBuilder::addBuilder(std::move(builder), name, code);
}